

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  Vdbe *p;
  int regPrior;
  Index *pPrior;
  Index *pIVar1;
  Index *pIdx;
  int *piVar2;
  int iPartIdxLabel;
  int *local_40;
  Vdbe *local_38;
  
  if ((pTab->tabFlags & 0x80) == 0) {
    pIVar1 = (Index *)0x0;
  }
  else {
    for (pIVar1 = pTab->pIndex;
        (pIVar1 != (Index *)0x0 && ((*(ushort *)&pIVar1->field_0x63 & 3) != 2));
        pIVar1 = pIVar1->pNext) {
    }
  }
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    p = pParse->pVdbe;
    regPrior = -1;
    pPrior = (Index *)0x0;
    piVar2 = aRegIdx;
    local_40 = aRegIdx;
    local_38 = p;
    do {
      if (aRegIdx == (int *)0x0) {
        if (pIdx != pIVar1) goto LAB_0018ee3d;
      }
      else if ((pIdx != pIVar1) && (*piVar2 != 0)) {
LAB_0018ee3d:
        if (iIdxNoSeek != iIdxCur) {
          regPrior = sqlite3GenerateIndexKey
                               (pParse,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
          sqlite3VdbeAddOp3(p,0x8c,iIdxCur,regPrior,
                            (uint)(&pIdx->nKeyCol)[(*(ushort *)&pIdx->field_0x63 & 8) == 0]);
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = 1;
          }
          pPrior = pIdx;
          aRegIdx = local_40;
          if (iPartIdxLabel != 0) {
            sqlite3VdbeResolveLabel(pParse->pVdbe,iPartIdxLabel);
            aRegIdx = local_40;
          }
        }
      }
      pIdx = pIdx->pNext;
      iIdxCur = iIdxCur + 1;
      piVar2 = piVar2 + 1;
    } while (pIdx != (Index *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3VdbeChangeP5(v, 1);  /* Cause IdxDelete to error if no entry found */
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}